

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O0

DetectorResult * ZXing::QRCode::DetectPureQR(BitMatrix *image)

{
  PointI size;
  ConcentricPattern a;
  ConcentricPattern b;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RSI;
  DetectorResult *in_RDI;
  float fVar5;
  double dVar6;
  double dVar7;
  PointT<double> PVar8;
  array<unsigned_short,_5UL> aVar9;
  float moduleSize;
  int dimension;
  unsigned_short fpWidth;
  type *d;
  type *p;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>_> *__range2;
  Pattern diagonal;
  PointI bl;
  PointI tr;
  PointI tl;
  int bottom;
  int right;
  int height;
  int width;
  int top;
  int left;
  int MIN_MODULES;
  PointT<double> *in_stack_fffffffffffffcf8;
  DetectorResult *in_stack_fffffffffffffd00;
  DetectorResult *this;
  undefined4 in_stack_fffffffffffffd08;
  Type type;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  undefined4 uVar10;
  PointT<int> in_stack_fffffffffffffd18;
  int b_00;
  PointT<int> in_stack_fffffffffffffd20;
  BitMatrix *this_00;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 uVar11;
  int in_stack_fffffffffffffd2c;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  PatternView *in_stack_fffffffffffffd38;
  pair<ZXing::PointT<int>,_ZXing::PointT<int>_> *this_01;
  float subSampling;
  pair<ZXing::PointT<int>,_ZXing::PointT<int>_> *this_02;
  DetectorResult *input;
  PointT<int> local_28c;
  PointT<int> local_284;
  PointT<int> local_27c [2];
  PointT<int> local_268;
  Quadrilateral<ZXing::PointT<int>_> local_260 [2];
  PointT<double> local_220;
  BitMatrix *in_stack_fffffffffffffdf0;
  PointF in_stack_fffffffffffffe00;
  double dVar13;
  undefined4 uStack_1bc;
  PointT<double> local_1b8;
  double local_1a8;
  double local_1a0;
  double local_198;
  DetectorResult *local_190;
  double local_188;
  DetectorResult *local_180;
  Type local_178;
  int iStack_174;
  int local_170;
  int local_158;
  unsigned_short local_152;
  _Type local_130;
  type local_120;
  type local_118;
  undefined8 local_f2;
  unsigned_short local_ea;
  type *local_e8;
  type *local_e0;
  PointT<int> local_d8;
  PointT<int> PStack_d0;
  const_iterator local_c0;
  const_iterator local_b8;
  PointT<int> local_b0;
  PointT<int> local_a8;
  PointT<int> local_a0;
  pair<ZXing::PointT<int>,_ZXing::PointT<int>_> local_98;
  pair<ZXing::PointT<int>,_ZXing::PointT<int>_> pStack_88;
  pair<ZXing::PointT<int>,_ZXing::PointT<int>_> pStack_78;
  initializer_list<std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>_> local_68;
  initializer_list<std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>_> *local_58;
  undefined8 local_4e;
  unsigned_short local_46;
  PointT<int> local_44;
  PointT<int> local_3c;
  PointT<int> local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_14 = 0x15;
  input = in_RDI;
  local_10 = in_RSI;
  bVar1 = BitMatrix::findBoundingBox
                    ((BitMatrix *)in_stack_fffffffffffffd38,
                     (int *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (int *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (int *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18,
                     in_stack_fffffffffffffd14);
  if (bVar1) {
    iVar2 = local_20 - local_24;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar2 < 2) {
      local_28 = local_18 + local_20 + -1;
      local_2c = local_1c + local_24 + -1;
      PointT<int>::PointT(&local_34,local_18,local_1c);
      PointT<int>::PointT(&local_3c,local_28,local_1c);
      PointT<int>::PointT(&local_44,local_18,local_2c);
      PointT<int>::PointT(&local_a0,1,1);
      std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>::
      pair<ZXing::PointT<int>_&,_ZXing::PointT<int>,_true>(&local_98,&local_34,&local_a0);
      this_01 = &pStack_88;
      PointT<int>::PointT(&local_a8,-1,1);
      std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>::pair<ZXing::PointT<int>_&,_true>
                (this_01,&local_3c,&local_a8);
      this_02 = &pStack_78;
      PointT<int>::PointT(&local_b0,1,-1);
      std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>::pair<ZXing::PointT<int>_&,_true>
                (this_02,&local_44,&local_b0);
      local_68._M_array = &local_98;
      local_68._M_len = 3;
      local_58 = &local_68;
      local_b8 = std::initializer_list<std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>_>::begin
                           (local_58);
      local_c0 = std::initializer_list<std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>_>::end
                           ((initializer_list<std::pair<ZXing::PointT<int>,_ZXing::PointT<int>_>_> *
                            )in_stack_fffffffffffffd00);
      for (; subSampling = (float)((ulong)this_01 >> 0x20), local_b8 != local_c0;
          local_b8 = local_b8 + 1) {
        local_d8 = local_b8->first;
        PStack_d0 = local_b8->second;
        local_e0 = std::get<0ul,ZXing::PointT<int>,ZXing::PointT<int>>
                             ((pair<ZXing::PointT<int>,_ZXing::PointT<int>_> *)0x2f0bb9);
        local_e8 = std::get<1ul,ZXing::PointT<int>,ZXing::PointT<int>>
                             ((pair<ZXing::PointT<int>,_ZXing::PointT<int>_> *)0x2f0bcb);
        local_118 = *local_e0;
        local_120 = *local_e8;
        BitMatrixCursor<ZXing::PointT<int>_>::BitMatrixCursor
                  ((BitMatrixCursor<ZXing::PointT<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (BitMatrix *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        aVar9 = BitMatrixCursor<ZXing::PointT<int>>::
                readPatternFromBlack<std::array<unsigned_short,5ul>>
                          ((BitMatrixCursor<ZXing::PointT<int>_> *)in_stack_fffffffffffffd20,
                           in_stack_fffffffffffffd18.y,in_stack_fffffffffffffd18.x);
        local_130._0_8_ = aVar9._M_elems._0_8_;
        local_f2._0_2_ = local_130[0];
        local_f2._2_2_ = local_130[1];
        local_f2._4_2_ = local_130[2];
        local_f2._6_2_ = local_130[3];
        local_130[4] = aVar9._M_elems[4];
        local_ea = local_130[4];
        local_4e._0_2_ = local_130[0];
        local_4e._2_2_ = local_130[1];
        local_4e._4_2_ = local_130[2];
        local_4e._6_2_ = local_130[3];
        local_46 = local_130[4];
        local_130 = aVar9._M_elems;
        PatternView::PatternView<5ul>
                  ((PatternView *)in_stack_fffffffffffffd00,
                   (Pattern<5UL> *)in_stack_fffffffffffffcf8);
        dVar13 = IsPattern<false,5,7>
                           (in_stack_fffffffffffffd38,
                            (FixedPattern<5,_7,_false> *)
                            CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                            in_stack_fffffffffffffd2c,(double)in_stack_fffffffffffffd20,
                            (double)in_stack_fffffffffffffd18);
        if (dVar13 == 0.0) {
          memset(in_RDI,0,0x40);
          DetectorResult::DetectorResult(in_stack_fffffffffffffd00);
          return input;
        }
      }
      local_152 = Reduce<std::array<unsigned_short,5ul>,unsigned_short,std::plus<unsigned_short>>
                            (&local_4e,0);
      uVar3 = local_152 / 2;
      PointT<double>::PointT(&local_1b8,1.0,1.0);
      PVar8 = ZXing::operator*((int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                               in_stack_fffffffffffffcf8);
      local_1a0 = PVar8.y;
      local_1a8 = PVar8.x;
      PVar8 = operator+<int,_double>
                        ((PointT<int> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_190 = (DetectorResult *)PVar8.y;
      local_198 = PVar8.x;
      local_178 = (Type)local_152;
      uVar4 = local_152 / 2;
      local_188 = local_198;
      local_180 = local_190;
      PointT<double>::PointT((PointT<double> *)&stack0xfffffffffffffe00,-1.0,1.0);
      PVar8 = ZXing::operator*((int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                               in_stack_fffffffffffffcf8);
      dVar6 = PVar8.y;
      dVar13 = PVar8.x;
      PVar8 = operator+<int,_double>
                        ((PointT<int> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      dVar7 = PVar8.y;
      iVar2 = PVar8.x._0_4_;
      uVar10 = PVar8.x._4_4_;
      this_00 = (BitMatrix *)CONCAT44(uStack_1bc,(uint)local_152);
      a._16_8_ = dVar13;
      a.super_PointF = in_stack_fffffffffffffe00;
      b.super_PointF.y = PVar8.x;
      b.super_PointF.x = dVar6;
      b._16_8_ = dVar7;
      this = local_180;
      type = local_178;
      EstimateDimension(in_stack_fffffffffffffdf0,a,b);
      b_00 = (int)((ulong)dVar7 >> 0x20);
      local_158 = local_170;
      fVar5 = (float)local_20 / (float)local_170;
      PointT<int>::PointT((PointT<int> *)&stack0xfffffffffffffdf4,local_170,local_170);
      size.y = iVar2;
      size.x = iStack_174;
      bVar1 = Version::IsValidSize(size,type);
      if (bVar1) {
        uVar11 = (undefined4)local_10;
        uVar12 = (undefined4)((ulong)local_10 >> 0x20);
        PointT<double>::PointT
                  (&local_220,
                   (double)((float)(local_158 + -1) * fVar5 + (float)local_18 + fVar5 / 2.0),
                   (double)((float)(local_158 + -1) * fVar5 + (float)local_1c + fVar5 / 2.0));
        PVar8.x._4_4_ = uVar12;
        PVar8.x._0_4_ = uVar11;
        PVar8.y._0_4_ = uVar3;
        PVar8.y._4_4_ = uVar4;
        bVar1 = BitMatrix::isIn<double>(this_00,PVar8,b_00);
        if (bVar1) {
          Deflate(&input->_bits,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                  (float)((ulong)this_02 >> 0x20),SUB84(this_02,0),subSampling);
          PointT<int>::PointT(&local_268,local_18,local_1c);
          PointT<int>::PointT(local_27c,local_28,local_1c);
          PointT<int>::PointT(&local_284,local_28,local_2c);
          PointT<int>::PointT(&local_28c,local_18,local_2c);
          Quadrilateral<ZXing::PointT<int>_>::Quadrilateral
                    (local_260,local_268,local_27c[0],local_284,local_28c);
          DetectorResult::DetectorResult
                    ((DetectorResult *)CONCAT44(uVar10,iVar2),(BitMatrix *)CONCAT44(iStack_174,type)
                     ,(QuadrilateralI *)this);
          BitMatrix::~BitMatrix((BitMatrix *)0x2f1150);
          return input;
        }
      }
      memset(in_RDI,0,0x40);
      DetectorResult::DetectorResult(this);
      return input;
    }
  }
  memset(in_RDI,0,0x40);
  DetectorResult::DetectorResult(in_stack_fffffffffffffd00);
  return input;
}

Assistant:

DetectorResult DetectPureQR(const BitMatrix& image)
{
	using Pattern = std::array<PatternView::value_type, PATTERN.size()>;

#ifdef PRINT_DEBUG
	SaveAsPBM(image, "weg.pbm");
#endif

	constexpr int MIN_MODULES = Version::SymbolSize(1, Type::Model2).x;

	int left, top, width, height;
	if (!image.findBoundingBox(left, top, width, height, MIN_MODULES) || std::abs(width - height) > 1)
		return {};
	int right  = left + width - 1;
	int bottom = top + height - 1;

	PointI tl{left, top}, tr{right, top}, bl{left, bottom};
	Pattern diagonal;
	// allow corners be moved one pixel inside to accommodate for possible aliasing artifacts
	for (auto [p, d] : {std::pair(tl, PointI{1, 1}), {tr, {-1, 1}}, {bl, {1, -1}}}) {
		diagonal = BitMatrixCursorI(image, p, d).readPatternFromBlack<Pattern>(1, width / 3 + 1);
		if (!IsPattern(diagonal, PATTERN))
			return {};
	}

	auto fpWidth = Reduce(diagonal);
	auto dimension =
		EstimateDimension(image, {tl + fpWidth / 2 * PointF(1, 1), fpWidth}, {tr + fpWidth / 2 * PointF(-1, 1), fpWidth}).dim;

	float moduleSize = float(width) / dimension;
	if (!Version::IsValidSize({dimension, dimension}, Type::Model2) ||
		!image.isIn(PointF{left + moduleSize / 2 + (dimension - 1) * moduleSize,
						   top + moduleSize / 2 + (dimension - 1) * moduleSize}))
		return {};

#ifdef PRINT_DEBUG
	LogMatrix log;
	LogMatrixWriter lmw(log, image, 5, "grid2.pnm");
	for (int y = 0; y < dimension; y++)
		for (int x = 0; x < dimension; x++)
			log(PointF(left + (x + .5f) * moduleSize, top + (y + .5f) * moduleSize));
#endif

	// Now just read off the bits (this is a crop + subsample)
	return {Deflate(image, dimension, dimension, top + moduleSize / 2, left + moduleSize / 2, moduleSize),
			{{left, top}, {right, top}, {right, bottom}, {left, bottom}}};
}